

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall EOPlus::Context::DoActions(Context *this)

{
  State *pSVar1;
  _Elt_pointer pAVar2;
  byte bVar3;
  int iVar4;
  runtime_error *this_00;
  _Elt_pointer pAVar5;
  _Elt_pointer pAVar6;
  _Map_pointer local_1c8;
  anon_class_8_1_8991fb9c do_action;
  Action action;
  
  pSVar1 = this->state;
  if (pSVar1 == (State *)0x0) {
    if (this->finished == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"No state selected");
      goto LAB_0012bfb8;
    }
  }
  else {
    if (100 < recursive_depth + 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Quest action recursion too deep");
LAB_0012bfb8:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar6 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    pAVar5 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    local_1c8 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    pAVar2 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    bVar3 = 0;
    recursive_depth = recursive_depth + 1;
    do_action.this = this;
    while (pAVar6 != pAVar2) {
      Action::Action(&action,pAVar6);
      if ((bool)((action.cond & ~If) == Else & bVar3)) {
        bVar3 = 1;
      }
      else if ((action.cond & ~Else) == If) {
        iVar4 = (*this->_vptr_Context[2])(this,&action.cond_expr);
        if ((char)iVar4 == '\0') {
          bVar3 = 0;
        }
        else {
          DoActions::anon_class_8_1_8991fb9c::operator()(&do_action,&action);
          bVar3 = 1;
        }
      }
      else {
        DoActions::anon_class_8_1_8991fb9c::operator()(&do_action,&action);
      }
      Action::~Action(&action);
      pAVar6 = pAVar6 + 1;
      if (pAVar6 == pAVar5) {
        pAVar6 = local_1c8[1];
        local_1c8 = local_1c8 + 1;
        pAVar5 = pAVar6 + 1;
      }
    }
    recursive_depth = recursive_depth + -1;
    CheckRules(this);
  }
  return;
}

Assistant:

void Context::DoActions()
	{
		if (!this->state)
		{
			if (this->finished)
				return;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			auto do_action = [&](const EOPlus::Action& action)
			{
				if (this->DoAction(action))
				{
					// *this may not be valid here
					--recursive_depth;
					return;
				}
			};

			bool last_cond = false;

			UTIL_FOREACH(this->state->actions, action)
			{
				if (action.cond == EOPlus::Action::ElseIf || action.cond == EOPlus::Action::Else)
				{
					if (last_cond)
						continue;
				}

				if (action.cond == EOPlus::Action::If || action.cond == EOPlus::Action::ElseIf)
				{
					last_cond = this->CheckRule(action.cond_expr);

					if (last_cond)
						do_action(action);
				}
				else
				{
					do_action(action);
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;
		this->CheckRules();
	}